

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

iterator __thiscall
QMap<QByteArray,_QProcEnvValue>::insert
          (QMap<QByteArray,_QProcEnvValue> *this,QByteArray *key,QProcEnvValue *value)

{
  bool bVar1;
  map<QByteArray,_QProcEnvValue,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QProcEnvValue>_>_>
  *in_RDX;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_QByteArray,_QProcEnvValue>_>,_bool> pVar2;
  QMap<QByteArray,_QProcEnvValue> copy;
  iterator in_stack_ffffffffffffff68;
  QMap<QByteArray,_QProcEnvValue> *in_stack_ffffffffffffff70;
  QProcEnvValue *in_stack_ffffffffffffff98;
  key_type *in_stack_ffffffffffffffa0;
  undefined1 *local_28;
  iterator local_20;
  _Base_ptr local_18;
  undefined1 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  bVar1 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QProcEnvValue,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QProcEnvValue>_>_>_>_>
          ::isShared(&in_stack_ffffffffffffff70->d);
  if (bVar1) {
    QMap(in_stack_ffffffffffffff70,
         (QMap<QByteArray,_QProcEnvValue> *)in_stack_ffffffffffffff68._M_node);
  }
  else {
    memset(&local_28,0,8);
    QMap((QMap<QByteArray,_QProcEnvValue> *)0x793bc8);
  }
  detach(in_stack_ffffffffffffff70);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QProcEnvValue,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QProcEnvValue>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QProcEnvValue,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QProcEnvValue>_>_>_>_>
                *)0x793bde);
  pVar2 = std::
          map<QByteArray,QProcEnvValue,std::less<QByteArray>,std::allocator<std::pair<QByteArray_const,QProcEnvValue>>>
          ::insert_or_assign<QProcEnvValue_const&>
                    (in_RDX,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  local_18 = (_Base_ptr)pVar2.first._M_node;
  local_10 = pVar2.second;
  iterator::iterator((iterator *)0x793c4e,in_stack_ffffffffffffff68);
  ~QMap((QMap<QByteArray,_QProcEnvValue> *)0x793c5a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)(iterator)local_20._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator insert(const Key &key, const T &value)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        // TODO: improve. In case of assignment, why copying first?
        detach();
        return iterator(d->m.insert_or_assign(key, value).first);
    }